

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadDigits
          (BigUnsigned<84> *this,char *begin,char *end,int significant_digits)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint32_t in_ECX;
  char *in_RDX;
  char *in_RSI;
  BigUnsigned<84> *in_RDI;
  bool bVar4;
  char *decimal_point;
  char digit;
  int digits_queued;
  uint32_t queued;
  int exponent_adjust;
  char *dp;
  int dropped_digits;
  bool after_decimal_point;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 uVar5;
  undefined1 uVar6;
  uint32_t value;
  int in_stack_ffffffffffffffac;
  BigUnsigned<84> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  char cVar7;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_24;
  uint32_t local_1c;
  char *local_18;
  char *local_10;
  
  value = in_ECX;
  iVar2 = Digits10();
  if (iVar2 + 1 < (int)value) {
    __assert_fail("significant_digits <= Digits10() + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_bigint.cc"
                  ,0xc3,
                  "int absl::strings_internal::BigUnsigned<84>::ReadDigits(const char *, const char *, int) [max_words = 84]"
                 );
  }
  SetToZero(in_RDI);
  bVar1 = false;
  local_10 = in_RSI;
  while( true ) {
    bVar4 = false;
    if (local_10 < in_RDX) {
      bVar4 = *local_10 == '0';
    }
    if (!bVar4) break;
    local_10 = local_10 + 1;
  }
  local_24 = 0;
  uVar6 = 0;
  local_18 = in_RDX;
  while( true ) {
    uVar5 = false;
    if (local_10 < local_18) {
      pcVar3 = std::prev<char_const*>
                         ((char *)in_RDI,
                          CONCAT17(uVar6,(uint7)CONCAT15(in_stack_ffffffffffffff9d,
                                                         CONCAT14(in_stack_ffffffffffffff9c,
                                                                  in_stack_ffffffffffffff98))));
      uVar5 = *pcVar3 == '0';
    }
    if ((bool)uVar5 == false) break;
    local_18 = local_18 + -1;
    local_24 = local_24 + 1;
  }
  if ((local_10 < local_18) &&
     (pcVar3 = std::prev<char_const*>
                         ((char *)in_RDI,
                          CONCAT17(uVar6,(uint7)CONCAT15(in_stack_ffffffffffffff9d,
                                                         CONCAT14(in_stack_ffffffffffffff9c,
                                                                  in_stack_ffffffffffffff98)))),
     *pcVar3 == '.')) {
    local_24 = 0;
    while( true ) {
      local_18 = local_18 + -1;
      bVar4 = false;
      if (local_10 < local_18) {
        pcVar3 = std::prev<char_const*>
                           ((char *)in_RDI,
                            CONCAT17(uVar6,CONCAT16(uVar5,(uint6)CONCAT14(in_stack_ffffffffffffff9c,
                                                                          in_stack_ffffffffffffff98)
                                                   )));
        bVar4 = *pcVar3 == '0';
      }
      if (!bVar4) break;
      local_24 = local_24 + 1;
    }
    in_stack_ffffffffffffff9d = 0;
  }
  else if ((local_24 != 0) &&
          (pcVar3 = std::find<char_const*,char>
                              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ),(char *)in_stack_ffffffffffffffb0),
          pcVar3 != local_18)) {
    local_24 = 0;
  }
  local_38 = local_24;
  iVar2 = 0;
  iVar8 = 0;
  local_1c = in_ECX;
  for (; bVar4 = 0 < (int)local_1c, local_10 != local_18 && bVar4; local_10 = local_10 + 1) {
    if (*local_10 == '.') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        local_38 = local_38 + -1;
      }
      in_stack_ffffffffffffffbc = CONCAT13(*local_10 + -0x30,(int3)in_stack_ffffffffffffffbc);
      local_1c = local_1c - 1;
      if (((local_1c == 0) &&
          (pcVar3 = std::next<char_const*>
                              ((char *)in_RDI,
                               CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(in_stack_ffffffffffffff9d,
                                                                      CONCAT14(local_10 != local_18
                                                                               && bVar4,
                                                  in_stack_ffffffffffffff98))))), pcVar3 != local_18
          )) && ((cVar7 = (char)(in_stack_ffffffffffffffbc >> 0x18), cVar7 == '\0' ||
                 (cVar7 == '\x05')))) {
        in_stack_ffffffffffffffbc = CONCAT13(cVar7 + '\x01',(int3)in_stack_ffffffffffffffbc);
      }
      iVar2 = iVar2 * 10 + (int)(char)(in_stack_ffffffffffffffbc >> 0x18);
      iVar8 = iVar8 + 1;
      if (iVar8 == 9) {
        MultiplyBy((BigUnsigned<84> *)CONCAT44(iVar2,9),in_stack_ffffffffffffffbc);
        AddWithCarry(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,value);
        iVar8 = 0;
        iVar2 = 0;
      }
    }
  }
  if (iVar8 != 0) {
    MultiplyBy((BigUnsigned<84> *)CONCAT44(iVar2,iVar8),in_stack_ffffffffffffffbc);
    AddWithCarry(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,value);
  }
  if ((local_10 < local_18) && (!bVar1)) {
    pcVar3 = std::find<char_const*,char>
                       ((char *)CONCAT44(iVar2,iVar8),
                        (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (char *)in_stack_ffffffffffffffb0);
    local_38 = local_38 + ((int)pcVar3 - (int)local_10);
  }
  return local_38;
}

Assistant:

int BigUnsigned<max_words>::ReadDigits(const char* begin, const char* end,
                                       int significant_digits) {
  assert(significant_digits <= Digits10() + 1);
  SetToZero();

  bool after_decimal_point = false;
  // Discard any leading zeroes before the decimal point
  while (begin < end && *begin == '0') {
    ++begin;
  }
  int dropped_digits = 0;
  // Discard any trailing zeroes.  These may or may not be after the decimal
  // point.
  while (begin < end && *std::prev(end) == '0') {
    --end;
    ++dropped_digits;
  }
  if (begin < end && *std::prev(end) == '.') {
    // If the string ends in '.', either before or after dropping zeroes, then
    // drop the decimal point and look for more digits to drop.
    dropped_digits = 0;
    --end;
    while (begin < end && *std::prev(end) == '0') {
      --end;
      ++dropped_digits;
    }
  } else if (dropped_digits) {
    // We dropped digits, and aren't sure if they're before or after the decimal
    // point.  Figure that out now.
    const char* dp = std::find(begin, end, '.');
    if (dp != end) {
      // The dropped trailing digits were after the decimal point, so don't
      // count them.
      dropped_digits = 0;
    }
  }
  // Any non-fraction digits we dropped need to be accounted for in our exponent
  // adjustment.
  int exponent_adjust = dropped_digits;

  uint32_t queued = 0;
  int digits_queued = 0;
  for (; begin != end && significant_digits > 0; ++begin) {
    if (*begin == '.') {
      after_decimal_point = true;
      continue;
    }
    if (after_decimal_point) {
      // For each fractional digit we emit in our parsed integer, adjust our
      // decimal exponent to compensate.
      --exponent_adjust;
    }
    char digit = (*begin - '0');
    --significant_digits;
    if (significant_digits == 0 && std::next(begin) != end &&
        (digit == 0 || digit == 5)) {
      // If this is the very last significant digit, but insignificant digits
      // remain, we know that the last of those remaining significant digits is
      // nonzero.  (If it wasn't, we would have stripped it before we got here.)
      // So if this final digit is a 0 or 5, adjust it upward by 1.
      //
      // This adjustment is what allows incredibly large mantissas ending in
      // 500000...000000000001 to correctly round up, rather than to nearest.
      ++digit;
    }
    queued = 10 * queued + static_cast<uint32_t>(digit);
    ++digits_queued;
    if (digits_queued == kMaxSmallPowerOfTen) {
      MultiplyBy(kTenToNth[kMaxSmallPowerOfTen]);
      AddWithCarry(0, queued);
      queued = digits_queued = 0;
    }
  }
  // Encode any remaining digits.
  if (digits_queued) {
    MultiplyBy(kTenToNth[digits_queued]);
    AddWithCarry(0, queued);
  }

  // If any insignificant digits remain, we will drop them.  But if we have not
  // yet read the decimal point, then we have to adjust the exponent to account
  // for the dropped digits.
  if (begin < end && !after_decimal_point) {
    // This call to std::find will result in a pointer either to the decimal
    // point, or to the end of our buffer if there was none.
    //
    // Either way, [begin, decimal_point) will contain the set of dropped digits
    // that require an exponent adjustment.
    const char* decimal_point = std::find(begin, end, '.');
    exponent_adjust += (decimal_point - begin);
  }
  return exponent_adjust;
}